

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

int attrset_set_attr(BigAttrSet *attrset,char *attrname,void *data,char *dtype,int nmemb)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  BigAttr *pBVar6;
  int *piVar7;
  char **ppcVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  char *dst;
  char ndtype [8];
  char local_58 [16];
  char *local_48;
  undefined8 uStack_40;
  
  attrset->dirty = 1;
  pcVar2 = strchr(attrname,0x20);
  if (((pcVar2 == (char *)0x0) && (pcVar2 = strchr(attrname,9), pcVar2 == (char *)0x0)) &&
     (pcVar2 = strchr(attrname,10), pcVar2 == (char *)0x0)) {
    uStack_40 = 0;
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_48 = attrname;
    pvVar3 = bsearch(local_58,attrset->attrlist,attrset->listused,0x20,attr_cmp);
    if (pvVar3 != (void *)0x0) {
      attrset_remove_attr(attrset,attrname);
    }
    _dtype_normalize(local_58,dtype);
    iVar1 = atoi(local_58 + 2);
    sVar4 = strlen(attrname);
    uVar11 = (long)(iVar1 * nmemb) + sVar4 + 1;
    sVar9 = attrset->bufused;
    sVar5 = attrset->bufsize;
    if (sVar5 - sVar9 < uVar11) {
      pcVar2 = attrset->attrbuf;
      sVar10 = attrset->listused;
      do {
        if (sVar10 != 0) {
          ppcVar8 = &attrset->attrlist->data;
          do {
            *ppcVar8 = *ppcVar8 + -(long)pcVar2;
            ppcVar8[-1] = ppcVar8[-1] + -(long)pcVar2;
            ppcVar8 = ppcVar8 + 4;
            sVar10 = sVar10 - 1;
          } while (sVar10 != 0);
        }
        pcVar2 = (char *)realloc(pcVar2,sVar5 * 2);
        attrset->attrbuf = pcVar2;
        sVar10 = attrset->listused;
        sVar5 = attrset->bufsize * 2;
        attrset->bufsize = sVar5;
        if (sVar10 != 0) {
          ppcVar8 = &attrset->attrlist->data;
          sVar9 = sVar10;
          do {
            *ppcVar8 = *ppcVar8 + (long)pcVar2;
            ppcVar8[-1] = ppcVar8[-1] + (long)pcVar2;
            ppcVar8 = ppcVar8 + 4;
            sVar9 = sVar9 - 1;
          } while (sVar9 != 0);
        }
        sVar9 = attrset->bufused;
      } while (sVar5 - sVar9 < uVar11);
    }
    else {
      pcVar2 = attrset->attrbuf;
      sVar10 = attrset->listused;
    }
    attrset->bufused = uVar11 + sVar9;
    pBVar6 = attrset->attrlist;
    sVar5 = sVar10;
    if (attrset->listsize == sVar10) {
      do {
        pBVar6 = (BigAttr *)realloc(pBVar6,sVar5 << 6);
        attrset->attrlist = pBVar6;
        sVar10 = attrset->listused;
        sVar5 = attrset->listsize * 2;
        attrset->listsize = sVar5;
      } while (sVar5 == sVar10);
    }
    pcVar2 = pcVar2 + sVar9;
    attrset->listused = sVar10 + 1;
    pBVar6 = pBVar6 + sVar10;
    dst = pBVar6->dtype;
    *(undefined8 *)(pBVar6->dtype + 4) = 0;
    pBVar6->name = (char *)0x0;
    pBVar6->data = (char *)0x0;
    pBVar6->nmemb = nmemb;
    dst[0] = '\0';
    dst[1] = '\0';
    dst[2] = '\0';
    dst[3] = '\0';
    dst[4] = '\0';
    dst[5] = '\0';
    dst[6] = '\0';
    dst[7] = '\0';
    _dtype_normalize(dst,dtype);
    pBVar6->name = pcVar2;
    strcpy(pcVar2,attrname);
    sVar4 = strlen(attrname);
    pBVar6->data = pcVar2 + sVar4 + 1;
    qsort(attrset->attrlist,attrset->listused,0x20,attr_cmp);
    uStack_40 = 0;
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_48 = attrname;
    piVar7 = (int *)bsearch(local_58,attrset->attrlist,attrset->listused,0x20,attr_cmp);
    if (*piVar7 == nmemb) {
      iVar1 = dtype_convert_simple
                        (*(void **)(piVar7 + 6),(char *)(piVar7 + 1),data,dtype,(long)nmemb);
      return iVar1;
    }
    pcVar2 = "attr nmemb mismatch";
    iVar1 = 0x6d1;
  }
  else {
    pcVar2 = "Attribute name cannot contain blanks (space, tab or newline)";
    iVar1 = 0x6c4;
  }
  _big_file_raise(pcVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                  ,iVar1);
  return -1;
}

Assistant:

static int
attrset_set_attr(BigAttrSet * attrset, const char * attrname, const void * data, const char * dtype, int nmemb)
{
    BigAttr * attr;
    attrset->dirty = 1;

    RAISEIF (
         strchr(attrname, ' ')
      || strchr(attrname, '\t')
      || strchr(attrname, '\n'),
      ex_name,
      "Attribute name cannot contain blanks (space, tab or newline)"
    );

    /* Remove it if it exists*/
    attr = attrset_lookup_attr(attrset, attrname);
    if(attr)
        attrset_remove_attr(attrset, attrname);
    /* add ensures the dtype has been normalized! */
    RAISEIF(0 != attrset_add_attr(attrset, attrname, dtype, nmemb),
            ex_add,
            "Failed to add attr");
    attr = attrset_lookup_attr(attrset, attrname);
    RAISEIF(attr->nmemb != nmemb,
            ex_mismatch,
            "attr nmemb mismatch");
    return dtype_convert_simple(attr->data, attr->dtype, data, dtype, attr->nmemb);

ex_name:
ex_mismatch:
ex_add:
    return -1;
}